

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::AccessorPrimitiveFieldGenerator::GenerateMembers
          (AccessorPrimitiveFieldGenerator *this,Printer *printer,bool lazy_init)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  bool bVar1;
  Type field_type;
  JavaType type;
  const_iterator cVar2;
  char *text;
  key_type local_50;
  
  this_00 = &this->variables_;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"default_constant","");
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar2._M_node != &(this->variables_)._M_t._M_impl.super__Rb_tree_header) {
    text = "private static final $type$ $default_constant$ =\n    $default_constant_value$;\n";
    if (lazy_init) {
      text = "private static $type$ $default_constant$;\n";
    }
    io::Printer::Print(printer,this_00,text);
  }
  io::Printer::Print(printer,this_00,
                     "private $type$ $name$_;\npublic $type$ get$capitalized_name$() {\n  return $name$_;\n}\npublic $message_name$ set$capitalized_name$($type$ value) {\n"
                    );
  field_type = FieldDescriptor::type(this->descriptor_);
  type = GetJavaType(field_type);
  bVar1 = anon_unknown_5::IsReferenceType(type);
  if (bVar1) {
    io::Printer::Print(printer,this_00,
                       "  if (value == null) {\n    throw new java.lang.NullPointerException();\n  }\n"
                      );
  }
  io::Printer::Print(printer,this_00,
                     "  $name$_ = value;\n  $set_has$;\n  return this;\n}\npublic boolean has$capitalized_name$() {\n  return $get_has$;\n}\npublic $message_name$ clear$capitalized_name$() {\n  $name$_ = $default_copy_if_needed$;\n  $clear_has$;\n  return this;\n}\n"
                    );
  return;
}

Assistant:

void AccessorPrimitiveFieldGenerator::
GenerateMembers(io::Printer* printer, bool lazy_init) const {
  if (variables_.find("default_constant") != variables_.end()) {
    // Those primitive types that need a saved default.
    if (lazy_init) {
      printer->Print(variables_,
        "private static $type$ $default_constant$;\n");
    } else {
      printer->Print(variables_,
        "private static final $type$ $default_constant$ =\n"
        "    $default_constant_value$;\n");
    }
  }
  printer->Print(variables_,
    "private $type$ $name$_;\n"
    "public $type$ get$capitalized_name$() {\n"
    "  return $name$_;\n"
    "}\n"
    "public $message_name$ set$capitalized_name$($type$ value) {\n");
  if (IsReferenceType(GetJavaType(descriptor_))) {
    printer->Print(variables_,
      "  if (value == null) {\n"
      "    throw new java.lang.NullPointerException();\n"
      "  }\n");
  }
  printer->Print(variables_,
    "  $name$_ = value;\n"
    "  $set_has$;\n"
    "  return this;\n"
    "}\n"
    "public boolean has$capitalized_name$() {\n"
    "  return $get_has$;\n"
    "}\n"
    "public $message_name$ clear$capitalized_name$() {\n"
    "  $name$_ = $default_copy_if_needed$;\n"
    "  $clear_has$;\n"
    "  return this;\n"
    "}\n");
}